

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_format.cpp
# Opt level: O0

char * ON_std_string_format_abi_cxx11_(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_928 [16];
  undefined8 local_918;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8e8;
  undefined8 local_8d8;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  exception *anon_var_0;
  undefined1 local_858 [8];
  va_list args;
  undefined1 auStack_838 [4];
  int n;
  ON_StringBuffer buffer;
  char stack_buffer [2048];
  char *format_local;
  string *str;
  
  if (in_AL != '\0') {
    local_8f8 = in_XMM0_Qa;
    local_8e8 = in_XMM1_Qa;
    local_8d8 = in_XMM2_Qa;
    local_8c8 = in_XMM3_Qa;
    local_8b8 = in_XMM4_Qa;
    local_8a8 = in_XMM5_Qa;
    local_898 = in_XMM6_Qa;
    local_888 = in_XMM7_Qa;
  }
  local_918 = in_RDX;
  local_910 = in_RCX;
  local_908 = in_R8;
  local_900 = in_R9;
  ON_StringBuffer::ON_StringBuffer
            ((ON_StringBuffer *)auStack_838,(char *)&buffer.m_heap_buffer_capacity,0x800);
  args[0].reg_save_area._4_4_ = 0;
  args[0].reg_save_area._3_1_ = 0;
  std::__cxx11::string::string((string *)format);
  if ((in_RSI != (char *)0x0) || (cRam0000000000000000 != '\0')) {
    args[0].overflow_arg_area = local_928;
    args[0]._0_8_ = &stack0x00000008;
    local_858._4_4_ = 0x30;
    local_858._0_4_ = 0x10;
    args[0].reg_save_area._4_4_ =
         ON_String::FormatVargsIntoBuffer
                   ((ON_StringBuffer *)auStack_838,in_RSI,(__va_list_tag *)local_858);
  }
  if (0 < args[0].reg_save_area._4_4_) {
    std::__cxx11::string::append(format,(ulong)_auStack_838);
  }
  args[0].reg_save_area._3_1_ = 1;
  ON_StringBuffer::~ON_StringBuffer((ON_StringBuffer *)auStack_838);
  return format;
}

Assistant:

std::string ON_VARGS_FUNC_CDECL ON_std_string_format(const char* format, ...) ON_NOEXCEPT
{
  char stack_buffer[2048];
  ON_StringBuffer buffer(stack_buffer, sizeof(stack_buffer) / sizeof(stack_buffer[0]));
  int n = 0;
  std::string str;

  if ( 0 != format || 0 != format[0] )
  {
    va_list args;
    va_start(args, format);
    n = ON_String::FormatVargsIntoBuffer(buffer, format, args);
    va_end(args);
  }

  if ( n > 0 )
  {
    // exceptions are swallowed.
    try { str.append(buffer.m_buffer, n); }
    catch (const std::exception& ) {}
  }

  return str;
}